

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

ArgEscapeData * findArgEscapes(ArgEscapeData *__return_storage_ptr__,QStringView s)

{
  ArgEscapeData *pAVar1;
  ushort uVar2;
  ArgEscapeData *pAVar3;
  ArgEscapeData *pAVar4;
  QChar *uc_begin;
  ArgEscapeData *pAVar5;
  ArgEscapeData *pAVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ushort uVar14;
  
  pAVar3 = (ArgEscapeData *)&DAT_aaaaaaaaaaaaaaaa;
  *(undefined1 **)__return_storage_ptr__ = &DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->min_escape = 0x7fffffff;
  __return_storage_ptr__->occurrences = 0;
  __return_storage_ptr__->locale_occurrences = 0;
  __return_storage_ptr__->escape_len = 0;
  if (s.m_size != 0) {
    pAVar3 = (ArgEscapeData *)((long)&((ArgEscapeData *)s.m_data)->min_escape + s.m_size * 2);
    iVar8 = 0x7fffffff;
    lVar7 = 0;
    lVar9 = 0;
    lVar10 = 0;
    pAVar4 = (ArgEscapeData *)s.m_data;
    do {
      pAVar6 = (ArgEscapeData *)&pAVar4->field_0x4;
      while (pAVar5 = (ArgEscapeData *)((long)&pAVar6[-1].escape_len + 6),
            *(short *)((long)&pAVar6[-1].escape_len + 4) != 0x25) {
        pAVar6 = (ArgEscapeData *)((long)&pAVar6->min_escape + 2);
        pAVar4 = (ArgEscapeData *)((long)&pAVar4->min_escape + 2);
        if (pAVar5 == pAVar3) {
          return pAVar3;
        }
      }
      if (pAVar5 == pAVar3) {
        return pAVar3;
      }
      uVar2 = (ushort)pAVar5->min_escape;
      uVar14 = uVar2;
      if (uVar2 == 0x4c) {
        if (pAVar6 == pAVar3) {
          return pAVar3;
        }
        uVar14 = (ushort)pAVar6->min_escape;
        pAVar5 = pAVar6;
      }
      iVar12 = uVar14 - 0x30;
      pAVar6 = pAVar5;
      if (iVar12 != -1 && 0xfff5 < (ushort)(uVar14 - 0x3a)) {
        pAVar1 = (ArgEscapeData *)((long)&pAVar5->min_escape + 2);
        pAVar6 = pAVar3;
        iVar13 = iVar12;
        if (pAVar1 != pAVar3) {
          iVar11 = *(ushort *)((long)&pAVar5->min_escape + 2) - 0x30;
          if (9 < (ushort)iVar11) {
            iVar11 = -1;
          }
          pAVar6 = (ArgEscapeData *)&pAVar5->field_0x4;
          iVar13 = iVar11 + iVar12 * 10;
          if (iVar11 == -1) {
            pAVar6 = pAVar1;
            iVar13 = iVar12;
          }
        }
        if (iVar13 <= iVar8) {
          if (iVar13 < iVar8) {
            __return_storage_ptr__->min_escape = iVar13;
            __return_storage_ptr__->locale_occurrences = 0;
            lVar7 = 0;
            lVar9 = 0;
            lVar10 = 0;
            iVar8 = iVar13;
          }
          lVar10 = lVar10 + 1;
          __return_storage_ptr__->occurrences = lVar10;
          if (uVar2 == 0x4c) {
            lVar9 = lVar9 + 1;
            __return_storage_ptr__->locale_occurrences = lVar9;
          }
          lVar7 = lVar7 + ((long)pAVar6 - (long)pAVar4 >> 1);
          __return_storage_ptr__->escape_len = lVar7;
        }
      }
      pAVar4 = pAVar6;
    } while (pAVar6 != pAVar3);
  }
  return pAVar3;
}

Assistant:

static ArgEscapeData findArgEscapes(QStringView s)
{
    const QChar *uc_begin = s.begin();
    const QChar *uc_end = s.end();

    ArgEscapeData d;

    d.min_escape = INT_MAX;
    d.occurrences = 0;
    d.escape_len = 0;
    d.locale_occurrences = 0;

    const QChar *c = uc_begin;
    while (c != uc_end) {
        while (c != uc_end && c->unicode() != '%')
            ++c;

        if (c == uc_end)
            break;
        const QChar *escape_start = c;
        if (++c == uc_end)
            break;

        bool locale_arg = false;
        if (c->unicode() == 'L') {
            locale_arg = true;
            if (++c == uc_end)
                break;
        }

        int escape = qArgDigitValue(*c);
        if (escape == -1)
            continue;

        // ### Qt 7: do not allow anything but ASCII digits
        // in arg()'s replacements.
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
        const QChar *escapeBegin = c;
        const QChar *escapeEnd = escapeBegin + 1;
#endif

        ++c;

        if (c != uc_end) {
            const int next_escape = qArgDigitValue(*c);
            if (next_escape != -1) {
                escape = (10 * escape) + next_escape;
                ++c;
#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
                ++escapeEnd;
#endif
            }
        }

#if QT_VERSION <= QT_VERSION_CHECK(7, 0, 0) && !defined(QT_BOOTSTRAPPED)
        checkArgEscape(QStringView(escapeBegin, escapeEnd));
#endif

        if (escape > d.min_escape)
            continue;

        if (escape < d.min_escape) {
            d.min_escape = escape;
            d.occurrences = 0;
            d.escape_len = 0;
            d.locale_occurrences = 0;
        }

        ++d.occurrences;
        if (locale_arg)
            ++d.locale_occurrences;
        d.escape_len += c - escape_start;
    }
    return d;
}